

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::ssl_stream<libtorrent::utp_stream>::
async_connect<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (ssl_stream<libtorrent::utp_stream> *this,endpoint_type *endpoint,
          _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  shared_ptr<std::function<void_(const_boost::system::error_code_&)>_> h;
  undefined1 auStack_58 [16];
  undefined1 local_48 [16];
  __shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
  local_38;
  _Head_base<0UL,_libtorrent::ssl_stream<libtorrent::utp_stream>_*,_false> local_28;
  
  std::
  make_shared<std::function<void(boost::system::error_code_const&)>,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>const&>
            ((_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
              *)auStack_58);
  local_48._0_8_ = connected;
  local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_38,
                 (__shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
                  *)auStack_58);
  local_28._M_head_impl = this;
  utp_stream::
  async_connect<std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>
            ((utp_stream *)this,endpoint,
             (_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
              *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  return;
}

Assistant:

void async_connect(endpoint_type const& endpoint, Handler const& handler)
	{
		// the connect is split up in the following steps:
		// 1. connect to peer
		// 2. perform SSL client handshake

		// to avoid unnecessary copying of the handler,
		// store it in a shared_ptr
		auto h = std::make_shared<handler_type>(handler);

		using std::placeholders::_1;
		m_sock.next_layer().async_connect(endpoint
			, std::bind(&ssl_stream::connected, this, _1, h));
	}